

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::~AssocArrayDeleteMethod(AssocArrayDeleteMethod *this)

{
  AssocArrayDeleteMethod *this_local;
  
  ~AssocArrayDeleteMethod(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

AssocArrayDeleteMethod() : SystemSubroutine("delete", SubroutineKind::Function) {}